

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::setNonbasicMove(HEkk *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  value_type val;
  long in_RDI;
  int8_t move;
  HighsInt iRow;
  HighsInt iVar;
  HighsInt num_tot;
  double upper;
  double lower;
  bool have_solution;
  undefined1 local_2d;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  iVar2 = *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)iVar6);
    if (*pvVar4 == '\0') {
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                          (long)iVar6);
      *pvVar4 = '\0';
    }
    else {
      if (iVar6 < *(int *)(in_RDI + 0x2198)) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21b8),(long)iVar6
                           );
        local_18 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21d0),(long)iVar6
                           );
        val = *pvVar5;
      }
      else {
        iVar3 = iVar6 - *(int *)(in_RDI + 0x2198);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2200),(long)iVar3
                           );
        local_18 = -*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21e8),(long)iVar3
                           );
        val = -*pvVar5;
      }
      if ((local_18 != val) || (NAN(local_18) || NAN(val))) {
        bVar1 = highs_isInfinity(-local_18);
        if (bVar1) {
          bVar1 = highs_isInfinity(val);
          if (bVar1) {
            local_2d = '\0';
          }
          else {
            local_2d = -1;
          }
        }
        else {
          bVar1 = highs_isInfinity(val);
          if (bVar1) {
            local_2d = '\x01';
          }
          else if (ABS(val) <= ABS(local_18)) {
            local_2d = -1;
          }
          else {
            local_2d = '\x01';
          }
        }
      }
      else {
        local_2d = '\0';
      }
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                          (long)iVar6);
      *pvVar4 = local_2d;
    }
  }
  return;
}

Assistant:

void HEkk::setNonbasicMove() {
  const bool have_solution = false;
  // Don't have a simplex basis since nonbasicMove is not set up.

  // Assign nonbasicMove using as much information as is available
  double lower;
  double upper;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  basis_.nonbasicMove_.resize(num_tot);

  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis_.nonbasicFlag_[iVar]) {
      // Basic variable
      basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      continue;
    }
    // Nonbasic variable
    if (iVar < lp_.num_col_) {
      lower = lp_.col_lower_[iVar];
      upper = lp_.col_upper_[iVar];
    } else {
      HighsInt iRow = iVar - lp_.num_col_;
      lower = -lp_.row_upper_[iRow];
      upper = -lp_.row_lower_[iRow];
    }
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Determine the bound to set the value to according to, in order of
        // priority
        //
        // 1. Any solution value
        if (have_solution) {
          double midpoint = 0.5 * (lower + upper);
          double value = info_.workValue_[iVar];
          if (value < midpoint) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
        // 2. Bound of original LP that is closer to zero
        if (move == kIllegalMoveValue) {
          if (fabs(lower) < fabs(upper)) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis_.nonbasicMove_[iVar] = move;
  }
}